

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O0

bool __thiscall tinyusdz::GPrim::has_primvar(GPrim *this,string *varname)

{
  size_type sVar1;
  undefined1 local_38 [8];
  string primvar_name;
  string *varname_local;
  GPrim *this_local;
  
  primvar_name.field_2._8_8_ = varname;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                 "primvars:",varname);
  sVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
          ::count(&this->props,(key_type *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  return sVar1 != 0;
}

Assistant:

bool GPrim::has_primvar(const std::string &varname) const {
  std::string primvar_name = kPrimvars + varname;
  return props.count(primvar_name);
}